

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solve_algorithms.cpp
# Opt level: O0

bool __thiscall Clasp::SolveAlgorithm::reportUnsat(SolveAlgorithm *this,Solver *s)

{
  int iVar1;
  Model *pMVar2;
  SharedContext *this_00;
  LogPtr pEVar3;
  Solver *in_RSI;
  long in_RDI;
  bool r2;
  bool r1;
  EventHandler *h;
  Model *m;
  bool local_32;
  byte local_31;
  byte local_23;
  
  pMVar2 = model((SolveAlgorithm *)0x1e34bd);
  this_00 = Solver::sharedContext(in_RSI);
  pEVar3 = SharedContext::eventHandler(this_00);
  local_23 = 1;
  if (*(long *)(in_RDI + 0x28) != 0) {
    local_23 = (**(code **)(**(long **)(in_RDI + 0x28) + 0x18))
                         (*(long **)(in_RDI + 0x28),in_RSI,pMVar2);
  }
  local_31 = 1;
  if (pEVar3 != (LogPtr)0x0) {
    iVar1 = (*(pEVar3->super_ModelHandler)._vptr_ModelHandler[3])(pEVar3,in_RSI,pMVar2);
    local_31 = (byte)iVar1;
  }
  local_32 = false;
  if ((local_23 & 1) != 0) {
    local_32 = (bool)(local_31 & 1);
  }
  return local_32;
}

Assistant:

bool SolveAlgorithm::reportUnsat(Solver& s) const {
	const Model&  m = model();
	EventHandler* h = s.sharedContext()->eventHandler();
	bool r1 = !onModel_ || onModel_->onUnsat(s, m);
	bool r2 = !h || h->onUnsat(s, m);
	return r1 && r2;
}